

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O2

void __thiscall QHttpNetworkRequest::setHTTP2Allowed(QHttpNetworkRequest *this,bool b)

{
  QHttpNetworkRequestPrivate *pQVar1;
  
  pQVar1 = QSharedDataPointer<QHttpNetworkRequestPrivate>::operator->(&this->d);
  pQVar1->http2Allowed = b;
  return;
}

Assistant:

void QHttpNetworkRequest::setHTTP2Allowed(bool b)
{
    d->http2Allowed = b;
}